

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::CopyImage::InvalidAlignmentTest::InvalidAlignmentTest
          (InvalidAlignmentTest *this,Context *context)

{
  bool bVar1;
  undefined1 local_74 [8];
  testCase src_test_case;
  testCase dst_test_case;
  GLenum res;
  GLuint y_val;
  GLuint x_val;
  GLuint w_val;
  GLuint h_val;
  GLuint w;
  GLuint h;
  GLuint y;
  GLuint x;
  Context *context_local;
  InvalidAlignmentTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"invalid_alignment",
             "Test verifies if INVALID_VALUE is generated when CopySubImageData is executed for regions with invalid alignment"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InvalidAlignmentTest_0322e7d8;
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  std::
  vector<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
  ::vector(&this->m_test_cases);
  for (h = 0; h < 2; h = h + 1) {
    for (w = 0; w < 2; w = w + 1) {
      for (h_val = 0; h_val < 2; h_val = h_val + 1) {
        for (w_val = 0; w_val < 2; w_val = w_val + 1) {
          local_74._0_4_ = InvalidAlignmentTest::h_vals[h_val];
          local_74._4_4_ = InvalidAlignmentTest::w_vals[w_val];
          src_test_case.m_height = InvalidAlignmentTest::x_vals[h];
          src_test_case.m_width = InvalidAlignmentTest::y_vals[w];
          bVar1 = false;
          if (((local_74._0_4_ == 4) && (bVar1 = false, local_74._4_4_ == 4)) &&
             (bVar1 = false, src_test_case.m_height == 0)) {
            bVar1 = src_test_case.m_width == 0;
          }
          src_test_case.m_dst_x = 0x501;
          if (bVar1) {
            src_test_case.m_dst_x = 0;
          }
          src_test_case.m_src_x = 0;
          src_test_case.m_src_y = 0;
          src_test_case.m_dst_y = local_74._0_4_;
          src_test_case.m_expected_result = local_74._4_4_;
          std::
          vector<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)&src_test_case.m_dst_y);
          std::
          vector<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)local_74);
        }
      }
    }
  }
  return;
}

Assistant:

InvalidAlignmentTest::InvalidAlignmentTest(deqp::Context& context)
	: TestCase(context, "invalid_alignment", "Test verifies if INVALID_VALUE is generated when CopySubImageData is "
											 "executed for regions with invalid alignment")
	, m_dst_tex_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	/* 16x16x6 are values used by prepareTex16x16x6 */
	static const GLuint invalid_h = 2;
	static const GLuint invalid_w = 2;
	static const GLuint invalid_x = 2;
	static const GLuint invalid_y = 2;
	static const GLuint valid_h   = 4;
	static const GLuint valid_w   = 4;

	static const GLuint h_vals[] = { valid_h, invalid_h };
	static const GLuint w_vals[] = { valid_w, invalid_w };
	static const GLuint x_vals[] = { 0, invalid_x };
	static const GLuint y_vals[] = { 0, invalid_y };

	static const GLuint n_h_vals = sizeof(h_vals) / sizeof(h_vals[0]);
	static const GLuint n_w_vals = sizeof(w_vals) / sizeof(w_vals[0]);
	static const GLuint n_x_vals = sizeof(x_vals) / sizeof(x_vals[0]);
	static const GLuint n_y_vals = sizeof(y_vals) / sizeof(y_vals[0]);

	for (GLuint x = 0; x < n_x_vals; ++x)
	{
		for (GLuint y = 0; y < n_y_vals; ++y)
		{
			for (GLuint h = 0; h < n_h_vals; ++h)
			{
				for (GLuint w = 0; w < n_w_vals; ++w)
				{
					const GLuint h_val = h_vals[h];
					const GLuint w_val = w_vals[w];
					const GLuint x_val = x_vals[x];
					const GLuint y_val = y_vals[y];
					const GLenum res   = ((valid_h == h_val) && (valid_w == w_val) && (0 == x_val) && (0 == y_val)) ?
										   GL_NO_ERROR :
										   GL_INVALID_VALUE;

					testCase dst_test_case = { h_val, w_val, 0, 0, x_val, y_val, res };

					testCase src_test_case = { h_val, w_val, x_val, y_val, 0, 0, res };

					m_test_cases.push_back(dst_test_case);
					m_test_cases.push_back(src_test_case);
				}
			}
		}
	}
}